

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPConnector.cpp
# Opt level: O2

void hwnet::TCPConnector::connectTimeout(Ptr *t,Ptr *self)

{
  bool bVar1;
  element_type *peVar2;
  Poller *this;
  __shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2> local_30;
  
  std::mutex::lock(&((self->super___shared_ptr<hwnet::TCPConnector,_(__gnu_cxx::_Lock_policy)2>).
                    _M_ptr)->mtx);
  std::__shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_30,
             &((self->super___shared_ptr<hwnet::TCPConnector,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
              connectTimer);
  if ((t->super___shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr ==
      local_30._M_ptr) {
    bVar1 = ((self->super___shared_ptr<hwnet::TCPConnector,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
            doing;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
    if (bVar1 == false) {
      std::__weak_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>::reset
                (&(((self->super___shared_ptr<hwnet::TCPConnector,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr)->connectTimer).
                  super___weak_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>);
      peVar2 = (self->super___shared_ptr<hwnet::TCPConnector,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      peVar2->doing = true;
      peVar2->gotError = true;
      peVar2->err = 0x6e;
      pthread_mutex_unlock((pthread_mutex_t *)&peVar2->mtx);
      this = ((self->super___shared_ptr<hwnet::TCPConnector,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
             poller_;
      std::__shared_ptr<hwnet::Task,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<hwnet::TCPConnector,void>
                ((__shared_ptr<hwnet::Task,(__gnu_cxx::_Lock_policy)2> *)&local_30,
                 &self->super___shared_ptr<hwnet::TCPConnector,_(__gnu_cxx::_Lock_policy)2>);
      Poller::PostTask(this,(Ptr *)&local_30,(ThreadPool *)0x0);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
      return;
    }
  }
  else {
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
  }
  pthread_mutex_unlock
            ((pthread_mutex_t *)
             &((self->super___shared_ptr<hwnet::TCPConnector,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
              mtx);
  return;
}

Assistant:

void TCPConnector::connectTimeout(const util::Timer::Ptr &t,TCPConnector::Ptr self) {
	auto post = false;
	self->mtx.lock();
	if(t == self->connectTimer.lock() && !self->doing){
		self->connectTimer.reset();
		self->doing = true;
		post = true;
		self->gotError = true;
		self->err = ETIMEDOUT;
	}
	self->mtx.unlock();
	if(post) {
		self->poller_->PostTask(self);
	}	
}